

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uint ttf_size;
  uint uVar1;
  uchar *ttf_data;
  ImFont *pIVar2;
  long lVar3;
  ulong uVar4;
  uchar *puVar5;
  byte bVar6;
  ImFontConfig *pIVar7;
  ushort *puVar8;
  ushort *puVar9;
  byte bVar10;
  ImFontConfig local_a8;
  
  bVar10 = 0;
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar1 = *compressed_ttf_data;
  if (((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) !=
       0x57bc0000) ||
     (uVar1 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar1 >> 0x18 != 0 || (uVar1 & 0xff0000) != 0) || (uVar1 & 0xff00) != 0) ||
     (uVar1 & 0xff) != 0)) {
LAB_00176bba:
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_a8.FontData = (void *)0x0;
      local_a8.FontDataSize = 0;
      local_a8.FontNo = 0;
      local_a8.SizePixels = 0.0;
      local_a8.OversampleH = 3;
      local_a8.OversampleV = 1;
      local_a8.PixelSnapH = false;
      local_a8.GlyphRanges = (ImWchar *)0x0;
      local_a8.MergeMode = false;
      local_a8.RasterizerFlags = 0;
      local_a8.RasterizerMultiply = 1.0;
      local_a8.GlyphExtraSpacing.x = 0.0;
      local_a8.GlyphExtraSpacing.y = 0.0;
      local_a8.GlyphOffset.x = 0.0;
      local_a8.GlyphOffset.y = 0.0;
      local_a8.Name[0] = '\0';
      local_a8.Name[1] = '\0';
      local_a8.Name[2] = '\0';
      local_a8.Name[3] = '\0';
      local_a8.Name[4] = '\0';
      local_a8.Name[5] = '\0';
      local_a8.Name[6] = '\0';
      local_a8.Name[7] = '\0';
      local_a8.Name[8] = '\0';
      local_a8.Name[9] = '\0';
      local_a8.Name[10] = '\0';
      local_a8.Name[0xb] = '\0';
      local_a8.Name[0xc] = '\0';
      local_a8.Name[0xd] = '\0';
      local_a8.Name[0xe] = '\0';
      local_a8.Name[0xf] = '\0';
      local_a8.Name[0x10] = '\0';
      local_a8.Name[0x11] = '\0';
      local_a8.Name[0x12] = '\0';
      local_a8.Name[0x13] = '\0';
      local_a8.Name[0x14] = '\0';
      local_a8.Name[0x15] = '\0';
      local_a8.Name[0x16] = '\0';
      local_a8.Name[0x17] = '\0';
      local_a8.Name[0x18] = '\0';
      local_a8.Name[0x19] = '\0';
      local_a8.Name[0x1a] = '\0';
      local_a8.Name[0x1b] = '\0';
      local_a8.Name[0x1c] = '\0';
      local_a8.Name[0x1d] = '\0';
      local_a8.Name[0x1e] = '\0';
      local_a8.Name[0x1f] = '\0';
      local_a8.DstFont = (ImFont *)0x0;
    }
    else {
      pIVar7 = &local_a8;
      for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
        pIVar7->FontData = font_cfg_template->FontData;
        font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar10 * -0x10 + 8);
        pIVar7 = (ImFontConfig *)((long)pIVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      if (local_a8.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                      ,0x518,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_a8.FontDataOwnedByAtlas = true;
    pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_a8,glyph_ranges);
    return pIVar2;
  }
  uVar1 = stb_decompress_length((uchar *)compressed_ttf_data);
  stb__barrier3 = (uchar *)((ulong)(uint)compressed_ttf_size + (long)compressed_ttf_data);
  puVar5 = ttf_data + uVar1;
  puVar8 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier2 = (uchar *)compressed_ttf_data;
  stb__barrier = puVar5;
  stb__barrier4 = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar6 = (byte)*puVar8;
    uVar1 = (uint)bVar6;
    if (bVar6 < 0x20) {
      if (bVar6 < 0x18) {
        if (bVar6 < 0x10) {
          if (bVar6 < 8) {
            if (bVar6 != 4) {
              if (uVar1 == 6) {
                uVar4 = ~((ulong)*(byte *)((long)puVar8 + 3) |
                          (ulong)*(byte *)((long)puVar8 + 1) << 0x10 | (ulong)(byte)puVar8[1] << 8);
                uVar1 = (uint)(byte)puVar8[2];
                goto LAB_00176a4a;
              }
              if (uVar1 == 7) {
                stb__lit((byte *)((long)puVar8 + 3),
                         (ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                 *(ushort *)((long)puVar8 + 1) >> 8) + 1);
                uVar4 = (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                       *(ushort *)((long)puVar8 + 1) >> 8);
                lVar3 = 4;
                goto LAB_00176b00;
              }
              goto LAB_00176b93;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar8 + 3) |
                         (ulong)*(byte *)((long)puVar8 + 1) << 0x10 | (ulong)(byte)puVar8[1] << 8),
                       (ushort)(puVar8[2] << 8 | puVar8[2] >> 8) + 1);
            puVar9 = puVar8 + 3;
          }
          else {
            stb__lit((uchar *)(puVar8 + 1),
                     ((uint)bVar6 * 0x100 + (uint)*(byte *)((long)puVar8 + 1)) - 0x7ff);
            uVar4 = (ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8);
            lVar3 = -0x7fd;
LAB_00176b00:
            puVar9 = (ushort *)((long)puVar8 + uVar4 + lVar3);
            if (puVar9 == puVar8) {
              bVar6 = (byte)*puVar8;
LAB_00176b93:
              if ((bVar6 != 5) || (*(byte *)((long)puVar8 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                              ,0x9d1,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar5) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                              ,0x9cb,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              goto LAB_00176bba;
            }
          }
        }
        else {
          uVar4 = -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                           ((uint)(byte)puVar8[1] | (uint)bVar6 << 0x10)) - 0xfffff);
          uVar1 = (uint)(ushort)(*(ushort *)((long)puVar8 + 3) << 8 |
                                *(ushort *)((long)puVar8 + 3) >> 8);
LAB_00176a4a:
          stb__match(stb__dout + uVar4,uVar1 + 1);
          puVar9 = (ushort *)((long)puVar8 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                            ((uint)(byte)puVar8[1] | (uint)bVar6 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar8 + 3) + 1);
        puVar9 = puVar8 + 2;
      }
    }
    else if ((char)bVar6 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar8 + 1),uVar1 - 0x7f);
      puVar9 = puVar8 + 1;
    }
    else {
      if (bVar6 < 0x40) {
        stb__lit((byte *)((long)puVar8 + 1),uVar1 - 0x1f);
        uVar4 = (ulong)(byte)*puVar8;
        lVar3 = -0x1e;
        goto LAB_00176b00;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar8 + 1) + (uint)bVar6 * 0x100) - 0x3fff),
                 (byte)puVar8[1] + 1);
      puVar9 = (ushort *)((long)puVar8 + 3);
    }
    puVar8 = puVar9;
    if (puVar5 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                    ,0x9d5,
                    "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}